

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing_v2.cpp
# Opt level: O2

string * create_file_with_removed_comments(string *__return_storage_ptr__,string *file_name)

{
  bool bVar1;
  char *pcVar2;
  string *psVar3;
  istream *piVar4;
  ostream *poVar5;
  string no_comment_name;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  ofstream no_comment_file_write;
  ifstream file;
  
  std::ifstream::ifstream(&file,(string *)file_name,_S_in);
  bVar1 = problem_with_file_to_read(&file,file_name);
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"",(allocator *)&no_comment_file_write);
  }
  else {
    std::__cxx11::string::substr((ulong)&no_comment_file_write,(ulong)file_name);
    pcVar2 = (char *)std::__cxx11::string::append((char *)&no_comment_file_write);
    psVar3 = (string *)std::__cxx11::string::append(pcVar2);
    std::__cxx11::string::string((string *)&no_comment_name,psVar3);
    std::__cxx11::string::~string((string *)&no_comment_file_write);
    std::ofstream::ofstream(&no_comment_file_write,(string *)&no_comment_name,_S_out);
    bVar1 = problem_with_file_to_write(&no_comment_file_write,&no_comment_name);
    if (bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&line);
    }
    else {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      while( true ) {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&file,(string *)&line);
        if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
        std::__cxx11::string::substr((ulong)&local_458,(ulong)&line);
        bVar1 = std::operator!=(&local_458,"<!--");
        std::__cxx11::string::~string((string *)&local_458);
        if (bVar1) {
          poVar5 = std::operator<<((ostream *)&no_comment_file_write,(string *)&line);
          std::endl<char,std::char_traits<char>>(poVar5);
        }
      }
      std::ifstream::close();
      std::ofstream::close();
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)no_comment_name._M_dataplus._M_p == &no_comment_name.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(no_comment_name.field_2._M_allocated_capacity._1_7_,
                      no_comment_name.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = no_comment_name.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = no_comment_name._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(no_comment_name.field_2._M_allocated_capacity._1_7_,
                      no_comment_name.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = no_comment_name._M_string_length;
      no_comment_name._M_string_length = 0;
      no_comment_name.field_2._M_local_buf[0] = '\0';
      no_comment_name._M_dataplus._M_p = (pointer)&no_comment_name.field_2;
      std::__cxx11::string::~string((string *)&line);
    }
    std::ofstream::~ofstream(&no_comment_file_write);
    std::__cxx11::string::~string((string *)&no_comment_name);
  }
  std::ifstream::~ifstream(&file);
  return __return_storage_ptr__;
}

Assistant:

string create_file_with_removed_comments(const string &file_name) {
    // Open the files:
    ifstream file(file_name);
    if (problem_with_file_to_read(file, file_name)) return "";
    string no_comment_name = file_name.substr(0, file_name.length() - 4).append("_no_comment").append(".txt");
    ofstream no_comment_file_write(no_comment_name);
    if (problem_with_file_to_write(no_comment_file_write, no_comment_name)) return "";
    // Copy content, but only NON-comment lines:
    string line;
    while (getline(file, line)) {
        if (line.substr(0, 4) != COMMENT) no_comment_file_write << line << endl;
    }
    file.close();
    no_comment_file_write.close();

    return no_comment_name;
}